

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

_Bool mips_cpu_exec_interrupt_mips64el(CPUState *cs,int interrupt_request)

{
  _Bool _Var1;
  CPUMIPSState_conflict5 *env;
  MIPSCPU_conflict2 *cpu;
  int interrupt_request_local;
  CPUState *cs_local;
  
  if ((interrupt_request & 2U) != 0) {
    _Var1 = cpu_mips_hw_interrupts_enabled((CPUMIPSState_conflict5 *)(cs[1].tb_jmp_cache + 0x143));
    if ((_Var1) &&
       (_Var1 = cpu_mips_hw_interrupts_pending
                          ((CPUMIPSState_conflict5 *)(cs[1].tb_jmp_cache + 0x143)), _Var1)) {
      cs->exception_index = 8;
      *(undefined4 *)(cs[1].tb_jmp_cache + 0x90b) = 0;
      mips_cpu_do_interrupt_mips64el(cs);
      return true;
    }
  }
  return false;
}

Assistant:

bool mips_cpu_exec_interrupt(CPUState *cs, int interrupt_request)
{
    if (interrupt_request & CPU_INTERRUPT_HARD) {
        MIPSCPU *cpu = MIPS_CPU(cs);
        CPUMIPSState *env = &cpu->env;

        if (cpu_mips_hw_interrupts_enabled(env) &&
            cpu_mips_hw_interrupts_pending(env)) {
            /* Raise it */
            cs->exception_index = EXCP_EXT_INTERRUPT;
            env->error_code = 0;
            mips_cpu_do_interrupt(cs);
            return true;
        }
    }
    return false;
}